

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * lshift(Bigint *b,int k)

{
  sbyte sVar1;
  int iVar2;
  uint32 *puVar3;
  uint32 *puVar4;
  uint *puVar5;
  uint local_54;
  uint32 z;
  uint32 *xe;
  uint32 *x1;
  uint32 *x;
  Bigint *b1;
  int n1;
  int n;
  int k1;
  int i;
  int k_local;
  Bigint *b_local;
  
  b_local = b;
  if ((k != 0) && ((b->x[0] != 0 || (b->wds != 1)))) {
    n1 = b->k;
    iVar2 = (k >> 5) + b->wds;
    b1._4_4_ = iVar2 + 1;
    for (n = b->maxwds; n < b1._4_4_; n = n << 1) {
      n1 = n1 + 1;
    }
    b_local = Balloc(n1);
    if (b_local == (Bigint *)0x0) {
      Bfree(b);
      b_local = (Bigint *)0x0;
    }
    else {
      xe = b_local->x;
      for (n = 0; n < k >> 5; n = n + 1) {
        *xe = 0;
        xe = xe + 1;
      }
      x1 = b->x;
      puVar3 = x1 + b->wds;
      if ((k & 0x1fU) == 0) {
        do {
          puVar4 = x1 + 1;
          *xe = *x1;
          xe = xe + 1;
          x1 = puVar4;
        } while (puVar4 < puVar3);
      }
      else {
        sVar1 = (sbyte)(k & 0x1fU);
        local_54 = 0;
        do {
          puVar5 = xe + 1;
          *xe = *x1 << sVar1 | local_54;
          puVar4 = x1 + 1;
          local_54 = *x1 >> (0x20U - sVar1 & 0x1f);
          xe = puVar5;
          x1 = puVar4;
        } while (puVar4 < puVar3);
        *puVar5 = local_54;
        if (local_54 != 0) {
          b1._4_4_ = iVar2 + 2;
        }
      }
      b_local->wds = b1._4_4_ + -1;
      Bfree(b);
    }
  }
  return b_local;
}

Assistant:

static Bigint *
lshift(Bigint *b, int k)
{
    int i, k1, n, n1;
    Bigint *b1;
    ULong *x, *x1, *xe, z;

    if (!k || (!b->x[0] && b->wds == 1))
        return b;

    n = k >> 5;
    k1 = b->k;
    n1 = n + b->wds + 1;
    for(i = b->maxwds; n1 > i; i <<= 1)
        k1++;
    b1 = Balloc(k1);
    if (b1 == NULL) {
        Bfree(b);
        return NULL;
    }
    x1 = b1->x;
    for(i = 0; i < n; i++)
        *x1++ = 0;
    x = b->x;
    xe = x + b->wds;
    if (k &= 0x1f) {
        k1 = 32 - k;
        z = 0;
        do {
            *x1++ = *x << k | z;
            z = *x++ >> k1;
        }
        while(x < xe);
        if ((*x1 = z))
            ++n1;
    }
    else do
             *x1++ = *x++;
        while(x < xe);
    b1->wds = n1 - 1;
    Bfree(b);
    return b1;
}